

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable ARKodeSPRKTable_Create(int s,int q,sunrealtype *a,sunrealtype *ahat)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int i;
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffcc;
  int local_2c;
  ARKodeSPRKTable local_8;
  
  if (((in_EDI < 1) || (in_RDX == 0)) || (in_RCX == 0)) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffcc);
    if (local_8 == (ARKodeSPRKTable)0x0) {
      local_8 = (ARKodeSPRKTable)0x0;
    }
    else {
      local_8->stages = in_EDI;
      local_8->q = in_ESI;
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        local_8->a[local_2c] = *(sunrealtype *)(in_RDX + (long)local_2c * 8);
        local_8->ahat[local_2c] = *(sunrealtype *)(in_RCX + (long)local_2c * 8);
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Create(int s, int q, const sunrealtype* a,
                                       const sunrealtype* ahat)
{
  if (s < 1 || !a || !ahat) { return NULL; }

  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(s);
  if (!sprk_table) { return NULL; }

  sprk_table->stages = s;
  sprk_table->q      = q;

  for (int i = 0; i < s; i++)
  {
    sprk_table->a[i]    = a[i];
    sprk_table->ahat[i] = ahat[i];
  }

  return sprk_table;
}